

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.cpp
# Opt level: O1

iterator __thiscall
spvtools::opt::InstructionList::iterator::InsertBefore
          (iterator *this,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *list)

{
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> *ptVar1;
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  _Var2;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  _Var3;
  pointer puVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> *p_Var8;
  undefined8 *in_RDX;
  pointer *__ptr;
  long *plVar9;
  
  p_Var8 = (_Head_base<0UL,_spvtools::opt::Instruction_*,_false> *)*in_RDX;
  ptVar1 = (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> *)
           in_RDX[1];
  _Var2.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)p_Var8->_M_head_impl;
  while( true ) {
    if (p_Var8 == (_Head_base<0UL,_spvtools::opt::Instruction_*,_false> *)ptVar1) {
      plVar6 = (long *)*in_RDX;
      plVar7 = (long *)in_RDX[1];
      plVar9 = plVar6;
      if (plVar7 != plVar6) {
        do {
          if ((long *)*plVar9 != (long *)0x0) {
            (**(code **)(*(long *)*plVar9 + 8))();
          }
          *plVar9 = 0;
          plVar9 = plVar9 + 1;
        } while (plVar9 != plVar7);
        in_RDX[1] = plVar6;
      }
      (this->super_iterator).node_ =
           (Instruction *)
           _Var2.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      return (iterator)(iterator)this;
    }
    _Var3._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         *(tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> *)
          &((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             *)p_Var8)->super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
    ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      *)p_Var8)->super__Head_base<0UL,_spvtools::opt::Instruction_*,_false> = (Instruction *)0x0;
    if (*(char *)((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 0x18) == '\x01') break;
    puVar4 = (list->
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         )puVar4[1]._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t ==
        (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         )0x0) {
      __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xaf,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    lVar5 = *(long *)((long)_Var3._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                     + 8);
    if (lVar5 != 0) {
      *(undefined8 *)(lVar5 + 0x10) =
           *(undefined8 *)
            ((long)_Var3._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x10);
      *(long *)(*(long *)((long)_Var3._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl + 0x10) + 8) = lVar5;
      *(undefined8 *)
       ((long)_Var3._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 8) = 0;
      *(undefined8 *)
       ((long)_Var3._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x10) = 0;
    }
    *(pointer *)
     ((long)_Var3._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 8) = puVar4;
    *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      *)((long)_Var3._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x10) =
         (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          )puVar4[2]._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t;
    puVar4[2]._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t = _Var3._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    *(tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> *)
     (*(long *)((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
               0x10) + 8) =
         _Var3._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    p_Var8 = &((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                *)p_Var8)[1].super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
  }
  __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                ,0xae,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

InstructionList::iterator InstructionList::iterator::InsertBefore(
    std::vector<std::unique_ptr<Instruction>>&& list) {
  Instruction* first_node = list.front().get();
  for (auto& i : list) {
    i.release()->InsertBefore(node_);
  }
  list.clear();
  return iterator(first_node);
}